

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEndWhileCommand.cxx
# Opt level: O0

bool __thiscall
cmEndWhileCommand::InvokeInitialPass
          (cmEndWhileCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *param_2)

{
  bool bVar1;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *param_2_local;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args_local;
  cmEndWhileCommand *this_local;
  
  local_20 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)this;
  bVar1 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::empty(args);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,
               "An ENDWHILE command was found outside of a proper WHILE ENDWHILE structure.",
               &local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,
               "An ENDWHILE command was found outside of a proper WHILE ENDWHILE structure. Or its arguments did not match the opening WHILE command."
               ,&local_79);
    cmCommand::SetError(&this->super_cmCommand,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  return false;
}

Assistant:

bool cmEndWhileCommand
::InvokeInitialPass(std::vector<cmListFileArgument> const& args,
                    cmExecutionStatus &)
{
  if (args.empty())
    {
    this->SetError("An ENDWHILE command was found outside of a proper "
                   "WHILE ENDWHILE structure.");
    }
  else
    {
    this->SetError("An ENDWHILE command was found outside of a proper "
                   "WHILE ENDWHILE structure. Or its arguments did not "
                   "match the opening WHILE command.");
    }

  return false;
}